

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckTypeStackEnd(TypeChecker *this,char *desc)

{
  Result RVar1;
  Label *in_RAX;
  Label *local_28;
  Label *label;
  
  local_28 = in_RAX;
  RVar1 = TopLabel(this,&local_28);
  if (RVar1.enum_ == Error) {
    RVar1.enum_ = Error;
  }
  else {
    RVar1.enum_._1_3_ = 0;
    RVar1.enum_._0_1_ =
         (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_start >> 2 != local_28->type_stack_limit;
    PrintStackIfFailed<>(this,RVar1,desc);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckTypeStackEnd(const char* desc) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  Result result = (type_stack_.size() == label->type_stack_limit)
                      ? Result::Ok
                      : Result::Error;
  PrintStackIfFailed(result, desc);
  return result;
}